

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O2

void __thiscall read_slot_v2::operator()(read_slot_v2 *this,detail_slot_v3 *ds,xr_reader *r)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  detail_palette *pdVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  detail_slot_v2 ds2;
  
  puVar1 = (r->field_2).m_p;
  uVar2 = *(undefined8 *)(puVar1 + 0xe);
  ds2.part[2].palette._1_1_ = SUB81((ulong)uVar2 >> 0x10,0);
  ds2.part[3].id = (uint8_t)((ulong)uVar2 >> 0x18);
  ds2._18_4_ = SUB84((ulong)uVar2 >> 0x20,0);
  uVar2 = *(undefined8 *)puVar1;
  uVar3 = *(undefined8 *)(puVar1 + 8);
  ds2.y_base = (float)uVar2;
  ds2.y_top = SUB84(uVar2,4);
  uVar4 = ds2._0_8_;
  ds2.part[0].id = (uint8_t)uVar3;
  ds2.part[0].palette = SUB82((ulong)uVar3 >> 8,0);
  ds2.part[1].id = (uint8_t)((ulong)uVar3 >> 0x18);
  ds2.part[1].palette = SUB82((ulong)uVar3 >> 0x20,0);
  ds2.part[2].id = (uint8_t)((ulong)uVar3 >> 0x30);
  ds2.part[2].palette._0_1_ = SUB81((ulong)uVar3 >> 0x38,0);
  (r->field_2).m_p = puVar1 + 0x16;
  ds2.y_base = (float)uVar2;
  ds2.y_top = SUB84(uVar2,4);
  fVar11 = ds2.y_top;
  if (ds2.y_top <= ds2.y_base) {
    uVar6 = 0;
  }
  else {
    fVar10 = ds2.y_base + 200.0;
    ds2._0_8_ = uVar4;
    fVar10 = floorf(fVar10 * 5.0);
    uVar9 = 0xfff;
    if ((uint)(long)fVar10 < 0xfff) {
      uVar9 = (uint)(long)fVar10;
    }
    fVar11 = ceilf((fVar11 - ((float)(int)uVar9 * 0.2 + -200.0)) * 10.0);
    uVar5 = 0xff;
    if ((uint)(long)fVar11 < 0xff) {
      uVar5 = (uint)(long)fVar11;
    }
    uVar6 = (ulong)(uVar5 << 0xc | uVar9);
  }
  *(ulong *)ds = (ulong)(ds2.part[2].id & 0x3f) << 0x20 |
                 (uint)ds2.part[1].id << 0x1a | uVar6 | (ulong)((ds2.part[0].id & 0x3f) << 0x14) |
                 (ulong)ds2.part[3].id << 0x26 | 0x7700000000000;
  pdVar8 = ds->palette + 3;
  for (lVar7 = 0x12; lVar7 != 6; lVar7 = lVar7 + -3) {
    *pdVar8 = *(detail_palette *)((long)ds2.part + lVar7 + -8);
    pdVar8 = pdVar8 + -1;
  }
  return;
}

Assistant:

void operator()(detail_slot_v3& ds, xr_reader& r) const {
	detail_slot_v2 ds2;
	r.r(ds2);
	if (ds2.y_top > ds2.y_base) {
		uint32_t y_base = uint32_t(std::floor((ds2.y_base + 200.f)*5.f));
		ds.y_base = y_base > 0xfff ? 0xfff : y_base;
		uint32_t y_height = uint32_t(std::ceil((ds2.y_top - ds.r_ybase())*10.f));
		ds.y_height = y_height > 0xff ? 0xff : y_height;
//xr_assert(ds2.y_base >= -200.f);
//xr_assert(ds.y_height != 0);
//xr_assert(ds.r_ybase() <= ds2.y_base + 0.0001);
//if (y_height <= 0xff)
//	xr_assert(ds.r_ybase() + ds.r_yheight() >= ds2.y_top);
	} else {
		ds.y_base = 0;
		ds.y_height = 0;
	}
	ds.id0 = ds2.part[0].id;
	ds.id1 = ds2.part[1].id;
	ds.id2 = ds2.part[2].id;
	ds.id3 = ds2.part[3].id;
	ds.c_dir = 7;
	ds.c_hemi = 7;
	ds.c_r = 0;
	ds.c_g = 0;
	ds.c_b = 0;
	for (uint_fast32_t i = 4; i != 0;) {
		--i;
		ds.palette[i] = ds2.part[i].palette;
	}
}